

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

uint32_t phmap::priv::LeadingZeros<unsigned_long>(unsigned_long x)

{
  long lVar1;
  uint32_t res;
  unsigned_long x_local;
  undefined4 local_c;
  
  if (x == 0) {
    local_c = 0x40;
  }
  else {
    lVar1 = 0x3f;
    if (x != 0) {
      for (; x >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    local_c = (uint)lVar1 ^ 0x3f;
  }
  return local_c;
}

Assistant:

uint32_t LeadingZeros(T x) {
    uint32_t res;
    PHMAP_IF_CONSTEXPR(sizeof(T) == 8)
        res = base_internal::CountLeadingZeros64(static_cast<uint64_t>(x));
    else
        res = base_internal::CountLeadingZeros32(static_cast<uint32_t>(x));
    return res;
}